

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMini.c
# Opt level: O0

int Abc_NodeFanin1Copy2(Abc_Obj_t *pObj)

{
  int c;
  int iVar1;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pObj_local;
  
  pAVar2 = Abc_ObjFanin1(pObj);
  iVar1 = (pAVar2->field_6).iTemp;
  c = Abc_ObjFaninC1(pObj);
  iVar1 = Abc_LitNotCond(iVar1,c);
  return iVar1;
}

Assistant:

int Abc_NodeFanin1Copy2( Abc_Obj_t * pObj )
{
    return Abc_LitNotCond( Abc_ObjFanin1(pObj)->iTemp, Abc_ObjFaninC1(pObj) );
}